

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino.c
# Opt level: O2

dino_template_error_t
template_generate_buffer
          (char *input_buffer,char **output_buffer,void *context_ptr,
          function_string_ptr_t function_string_ptr,function_boolean_ptr_t function_boolean_ptr,
          char *function,char *file,int line)

{
  dino_template_error_t dVar1;
  dino_string_ptr input_buffer_00;
  dino_string_ptr output_buffer_00;
  char *pcVar2;
  
  log_message(6,function,file,line,"dino_template_generate_buffer");
  input_buffer_00 = dino_string_new_with_str(input_buffer);
  output_buffer_00 = dino_string_new();
  dVar1 = dino_template_generate_buffer
                    (input_buffer_00,output_buffer_00,context_ptr,function_string_ptr,
                     function_boolean_ptr);
  if (output_buffer != (char **)0x0) {
    pcVar2 = dino_string_c_ptr(output_buffer_00);
    *output_buffer = pcVar2;
  }
  dino_string_delete(output_buffer_00,output_buffer == (char **)0x0);
  return dVar1;
}

Assistant:

dino_template_error_t DINO_EXTERN template_generate_buffer(const char *input_buffer,
                                                           char **output_buffer,
                                                           void *context_ptr,
                                                           function_string_ptr_t function_string_ptr,
                                                           function_boolean_ptr_t function_boolean_ptr,
                                                           const char *function, const char *file, int line) {
    log_message(LOG_INFO, function, file, line, "dino_template_generate_buffer");

    dino_string_ptr input_buffer_ptr = dino_string_new_with_str(input_buffer);
    dino_string_ptr output_buffer_ptr = dino_string_new();

    dino_template_error_t error = dino_template_generate_buffer(input_buffer_ptr,
                                                                output_buffer_ptr,
                                                                context_ptr,
                                                                function_string_ptr,
                                                                function_boolean_ptr);

    if (output_buffer) {
        *output_buffer = dino_string_c_ptr(output_buffer_ptr);
        dino_string_delete(output_buffer_ptr, false);
    } else {
        dino_string_delete(output_buffer_ptr, true);
    }

    return error;
}